

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O0

_Bool evaluate_block_definition(Scope *scope,BlockDefinition *block_definition)

{
  char *name;
  _Bool _Var1;
  Value *value_00;
  Scope *pSVar2;
  Value *pVVar3;
  GeneratorValue *value_01;
  Value *value;
  Value *condition_value_1;
  Value *for_block_value;
  GeneratorValue *generator_value;
  Value *right_value;
  char *identifier;
  InfixExpression *in_infix_expression;
  ForBlockDefinition *for_block_definition;
  ElseBlockDefinition *else_block_definition;
  _Bool condition;
  Value *condition_value;
  IfBlockDefinition *if_block_definition;
  size_t i;
  IfElseGroupBlockDefinition *if_else_group_block_definition;
  Scope *block_scope;
  BlockDefinition *block_definition_local;
  Scope *scope_local;
  
  switch(block_definition->block_definition_type) {
  case BlockDefinitionTypeIfBlock:
    pSVar2 = new_scope(scope,*(Block **)(block_definition + 2),ScopeTypeNormalScope);
    if (*(long *)(block_definition + 4) != 0) {
      pVVar3 = evaluate_expression(pSVar2,*(Expression **)(block_definition + 4));
      free_value(pVVar3);
    }
    pVVar3 = evaluate_expression(pSVar2,*(Expression **)(block_definition + 6));
    scope_local._7_1_ = convert_to_bool(pVVar3);
    if (scope_local._7_1_) {
      value_00 = evaluate_scope(pSVar2);
      free_value(value_00);
    }
    free_value(pVVar3);
    free_scope(pSVar2);
    break;
  case BlockDefinitionTypeElseBlock:
    pSVar2 = new_scope(scope,*(Block **)(block_definition + 2),ScopeTypeNormalScope);
    pVVar3 = evaluate_scope(pSVar2);
    free_value(pVVar3);
    free_scope(pSVar2);
    scope_local._7_1_ = true;
    break;
  case BlockDefinitionTypeIfElseGroupBlock:
    if_block_definition = (IfBlockDefinition *)0x0;
    while ((if_block_definition < *(IfBlockDefinition **)(block_definition + 2) &&
           (_Var1 = evaluate_block_definition
                              (scope,*(BlockDefinition **)
                                      (*(long *)(block_definition + 4) +
                                      (long)if_block_definition * 8)), !_Var1))) {
      if_block_definition =
           (IfBlockDefinition *)
           ((long)&(if_block_definition->block_definition).block_definition_type + 1);
    }
    if ((if_block_definition == *(IfBlockDefinition **)(block_definition + 2)) &&
       (*(long *)(block_definition + 6) != 0)) {
      evaluate_block_definition(scope,*(BlockDefinition **)(block_definition + 6));
    }
    scope_local._7_1_ = true;
    break;
  case BlockDefinitionTypeForBlock:
    pSVar2 = new_scope(scope,*(Block **)(block_definition + 2),ScopeTypeNormalScope);
    if (*(long *)(block_definition + 4) != 0) {
      pVVar3 = evaluate_expression(pSVar2,*(Expression **)(block_definition + 4));
      free_value(pVVar3);
    }
    if ((**(int **)(block_definition + 6) == 6) &&
       (*(int *)(*(long *)(block_definition + 6) + 0x10) == 0x1a)) {
      name = *(char **)(*(long *)(*(long *)(*(long *)(block_definition + 6) + 0x18) + 8) + 8);
      value_01 = (GeneratorValue *)
                 evaluate_expression(pSVar2,*(Expression **)(*(long *)(block_definition + 6) + 0x20)
                                    );
      if ((value_01->value).value_type == ValueTypeGeneratorValue) {
        generator_value = (GeneratorValue *)0x0;
        for_block_value = (Value *)value_01;
      }
      else {
        for_block_value = convert_to_generator_value((Value *)value_01);
        generator_value = value_01;
      }
      while (pVVar3 = fetch_value_from_generator_value((GeneratorValue *)for_block_value),
            pVVar3->value_type != ValueTypeNullValue) {
        scope_set_variable(pSVar2,ValueTypeNullValue,name,pVVar3,0);
        pVVar3 = evaluate_scope(pSVar2);
        free_value(pVVar3);
      }
      free_value(for_block_value);
      if (generator_value != (GeneratorValue *)0x0) {
        free_value(&generator_value->value);
      }
      free_scope(pSVar2);
    }
    else {
      value = evaluate_expression(pSVar2,*(Expression **)(block_definition + 6));
      while (_Var1 = convert_to_bool(value), _Var1) {
        free_value(value);
        pVVar3 = evaluate_scope(pSVar2);
        free_value(pVVar3);
        if (*(long *)(block_definition + 8) != 0) {
          pVVar3 = evaluate_expression(pSVar2,*(Expression **)(block_definition + 8));
          free_value(pVVar3);
        }
        value = evaluate_expression(pSVar2,*(Expression **)(block_definition + 6));
      }
      free_value(value);
      free_scope(pSVar2);
    }
    scope_local._7_1_ = true;
    break;
  default:
    scope_local._7_1_ = true;
  }
  return scope_local._7_1_;
}

Assistant:

bool evaluate_block_definition(Scope *scope, BlockDefinition *block_definition) {
  Scope *block_scope = NULL;

  switch (block_definition->block_definition_type) {
    case BlockDefinitionTypeIfElseGroupBlock: {
      IfElseGroupBlockDefinition *if_else_group_block_definition = (IfElseGroupBlockDefinition *) block_definition;

      size_t i;

      for (i = 0; i < if_else_group_block_definition->if_block_definitions_length; i++) {
        if (evaluate_block_definition(scope, (BlockDefinition *) if_else_group_block_definition->if_block_definitions[i])) {
          break;
        }
      }

      if (i == if_else_group_block_definition->if_block_definitions_length && if_else_group_block_definition->else_block_definition != NULL) {
        evaluate_block_definition(scope, (BlockDefinition *) if_else_group_block_definition->else_block_definition);
      }

      return true;
    }

    case BlockDefinitionTypeIfBlock: {
      IfBlockDefinition *if_block_definition = (IfBlockDefinition *) block_definition;

      block_scope = new_scope(scope, if_block_definition->block, ScopeTypeNormalScope);

      if (if_block_definition->pre_expression != NULL) {
        free_value(evaluate_expression(block_scope, if_block_definition->pre_expression));
      }

      Value *condition_value = evaluate_expression(block_scope, if_block_definition->condition);
      bool condition = convert_to_bool(condition_value);

      if (condition) {
        free_value(evaluate_scope(block_scope));
      }

      free_value(condition_value);
      free_scope(block_scope);

      return condition;
    }

    case BlockDefinitionTypeElseBlock: {
      ElseBlockDefinition *else_block_definition = (ElseBlockDefinition *) block_definition;

      block_scope = new_scope(scope, else_block_definition->block, ScopeTypeNormalScope);

      free_value(evaluate_scope(block_scope));
      free_scope(block_scope);

      return true;
    }

    case BlockDefinitionTypeForBlock: {
      ForBlockDefinition *for_block_definition = (ForBlockDefinition *) block_definition;

      block_scope = new_scope(scope, for_block_definition->block, ScopeTypeNormalScope);

      if (for_block_definition->pre_expression != NULL) {
        free_value(evaluate_expression(block_scope, for_block_definition->pre_expression));
      }

      if (for_block_definition->condition->expression_type == ExpressionTypeInfixExpression && (((InfixExpression *) for_block_definition->condition)->operator == IN_OP)) {
        InfixExpression *in_infix_expression = (InfixExpression *) for_block_definition->condition;

        char *identifier = ((StringLiteral *) in_infix_expression->left_expression->literal)->string_literal;

        Value *right_value = evaluate_expression(block_scope, in_infix_expression->right_expression);
        GeneratorValue *generator_value;

        if (right_value->value_type == ValueTypeGeneratorValue) {
          generator_value = (GeneratorValue *) right_value;
          right_value = NULL;
        }
        else {
          generator_value = (GeneratorValue *) convert_to_generator_value(right_value);
        }

        Value *for_block_value;

        while ((for_block_value = fetch_value_from_generator_value(generator_value))->value_type != ValueTypeNullValue) {
          scope_set_variable(block_scope, ValueTypeNullValue, identifier, for_block_value, false);

          free_value(evaluate_scope(block_scope));
        }

        free_value((Value *) generator_value);
        if (right_value != NULL) free_value(right_value);
        free_scope(block_scope);
      }
      else {
        Value *condition_value = evaluate_expression(block_scope, for_block_definition->condition);

        while (convert_to_bool(condition_value)) {
          free_value(condition_value);

          Value *value = evaluate_scope(block_scope);
          free_value(value);

          if (for_block_definition->post_expression != NULL) {
            free_value(evaluate_expression(block_scope, for_block_definition->post_expression));
          }

          condition_value = evaluate_expression(block_scope, for_block_definition->condition);
        }

        free_value(condition_value);
        free_scope(block_scope);
      }

      return true;
    }

    default: {
      return true;
    }
  }
}